

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O1

int __thiscall
google::protobuf::internal::ExtensionSet::GetEnum(ExtensionSet *this,int number,int default_value)

{
  bool bVar1;
  int iVar2;
  AllocatedData AVar3;
  string *extraout_RAX;
  AllocatedData AVar4;
  string *extraout_RAX_00;
  string *extraout_RAX_01;
  Extension *pEVar5;
  const_reference piVar6;
  string *psVar7;
  uint in_ECX;
  uint uVar8;
  uint extraout_EDX;
  int index;
  AllocatedData extraout_RDX;
  undefined1 *puVar9;
  ExtensionSet *pEVar10;
  LogMessageFatal *pLVar11;
  FieldDescriptor *in_R8;
  pair<google::protobuf::internal::ExtensionSet::Extension_*,_bool> pVar12;
  LogMessageFatal aLStack_a8 [16];
  ulong uStack_98;
  Extension *pEStack_90;
  ExtensionSet EStack_80;
  ExtensionSet EStack_48;
  undefined1 local_20 [16];
  
  AVar3.flat = (KeyValue *)FindOrNull(this,number);
  if (AVar3.flat == (KeyValue *)0x0) {
    return default_value;
  }
  if ((((AVar3.flat)->second).field_0.uint64_t_value & 0x20000) != 0) {
    return default_value;
  }
  if (*(bool *)((long)&((AVar3.flat)->second).field_0 + 1) == false) {
    psVar7 = (string *)0x0;
  }
  else {
    psVar7 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                       (0,1,
                        "(*extension).is_repeated ? REPEATED_FIELD : OPTIONAL_FIELD == OPTIONAL_FIELD"
                       );
  }
  if (psVar7 == (string *)0x0) {
    bVar1 = ((AVar3.flat)->second).field_0.bool_value;
    uVar8 = bVar1 - 0x13;
    if ((byte)uVar8 < 0xee) {
      puVar9 = local_20;
      GetEnum();
LAB_0025bbf1:
      in_ECX = uVar8;
      psVar7 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                         ((long)puVar9,8,
                          "cpp_type((*extension).type) == WireFormatLite::CPPTYPE_ENUM");
    }
    else {
      in_ECX = 0x439360;
      puVar9 = (undefined1 *)
               (ulong)*(uint *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)bVar1 * 4);
      uVar8 = 0x439360;
      if (puVar9 != (undefined1 *)0x8) goto LAB_0025bbf1;
      psVar7 = (string *)0x0;
    }
    if (psVar7 == (string *)0x0) {
      return ((anon_union_8_9_fdc4a54a_for_Extension_0 *)&(AVar3.flat)->first)->enum_value;
    }
  }
  else {
    GetEnum();
    psVar7 = extraout_RAX;
  }
  iVar2 = (int)psVar7;
  pEVar10 = (ExtensionSet *)local_20;
  GetEnum();
  EStack_48.map_.flat = AVar3.flat;
  AVar4.flat = (KeyValue *)FindOrNull(pEVar10,iVar2);
  AVar3 = extraout_RDX;
  if ((AVar4.flat == (KeyValue *)0x0) ||
     (AVar3 = extraout_RDX, (((AVar4.flat)->second).field_0.uint64_t_value & 0x20000) != 0))
  goto LAB_0025bc6e;
  if (*(bool *)((long)&((AVar4.flat)->second).field_0 + 1) == false) {
    psVar7 = (string *)0x0;
  }
  else {
    psVar7 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                       (0,1,
                        "(*extension).is_repeated ? REPEATED_FIELD : OPTIONAL_FIELD == OPTIONAL_FIELD"
                       );
  }
  if (psVar7 == (string *)0x0) {
    bVar1 = ((AVar4.flat)->second).field_0.bool_value;
    uVar8 = bVar1 - 0x13;
    if ((byte)uVar8 < 0xee) {
      pEVar10 = &EStack_48;
      GetRefEnum();
LAB_0025bc98:
      in_ECX = uVar8;
      psVar7 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                         ((long)pEVar10,8,
                          "cpp_type((*extension).type) == WireFormatLite::CPPTYPE_ENUM");
    }
    else {
      in_ECX = 0x439360;
      pEVar10 = (ExtensionSet *)
                (ulong)*(uint *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)bVar1 * 4);
      uVar8 = 0x439360;
      if (pEVar10 != (ExtensionSet *)0x8) goto LAB_0025bc98;
      psVar7 = (string *)0x0;
    }
    AVar3.flat = AVar4.flat;
    if (psVar7 == (string *)0x0) {
LAB_0025bc6e:
      return AVar3._0_4_;
    }
  }
  else {
    GetRefEnum();
    psVar7 = extraout_RAX_00;
  }
  iVar2 = (int)psVar7;
  pEVar10 = &EStack_48;
  GetRefEnum();
  pEStack_90 = (Extension *)0x25bcde;
  EStack_80.map_.flat = AVar4.flat;
  pVar12 = Insert(pEVar10,iVar2);
  pEVar5 = pVar12.first;
  pEVar5->descriptor = in_R8;
  if (((undefined1  [16])pVar12 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    if (pEVar5->is_repeated != false) goto LAB_0025bd7d;
    psVar7 = (string *)0x0;
LAB_0025bd2e:
    if (psVar7 != (string *)0x0) {
      pEStack_90 = (Extension *)0x25bdd2;
      SetEnum();
      goto LAB_0025bdd2;
    }
    if ((byte)(pEVar5->type - 0x13) < 0xee) {
      pEVar10 = &EStack_80;
      pEStack_90 = (Extension *)0x25bd9c;
      SetEnum(pEVar10);
      goto LAB_0025bd9c;
    }
    if ((ulong)*(uint *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)pEVar5->type * 4) == 8) {
      psVar7 = (string *)0x0;
    }
    else {
      pEStack_90 = (Extension *)0x25bdc3;
      psVar7 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                         ((ulong)*(uint *)(WireFormatLite::kFieldTypeToCppTypeMap +
                                          (ulong)pEVar5->type * 4),8,
                          "cpp_type((*extension).type) == WireFormatLite::CPPTYPE_ENUM");
    }
    if (psVar7 == (string *)0x0) goto LAB_0025bd5f;
  }
  else {
    pEVar5->type = (FieldType)extraout_EDX;
    if ((byte)((FieldType)extraout_EDX - 0x13) < 0xee) {
      pEStack_90 = (Extension *)0x25bd7d;
      SetEnum(&EStack_80);
LAB_0025bd7d:
      pEStack_90 = (Extension *)0x25bd90;
      psVar7 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                         (0,1,
                          "(*extension).is_repeated ? REPEATED_FIELD : OPTIONAL_FIELD == OPTIONAL_FIELD"
                         );
      goto LAB_0025bd2e;
    }
    pEVar10 = (ExtensionSet *)
              (ulong)*(uint *)(WireFormatLite::kFieldTypeToCppTypeMap +
                              (ulong)(extraout_EDX & 0xff) * 4);
    if (pEVar10 == (ExtensionSet *)0x8) {
      psVar7 = (string *)0x0;
    }
    else {
LAB_0025bd9c:
      pEStack_90 = (Extension *)0x25bdad;
      psVar7 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                         ((long)pEVar10,8,
                          "cpp_type(extension->type) == WireFormatLite::CPPTYPE_ENUM");
    }
    if (psVar7 == (string *)0x0) {
      pEVar5->is_repeated = false;
      pEVar5->field_0xa = pEVar5->field_0xa & 0xfe;
      psVar7 = (string *)0x0;
LAB_0025bd5f:
      pEVar5->field_0xa = pEVar5->field_0xa & 0xfd;
      (pEVar5->field_0).uint32_t_value = in_ECX;
      return (int)psVar7;
    }
LAB_0025bdd2:
    pEStack_90 = (Extension *)0x25bddf;
    SetEnum();
    psVar7 = extraout_RAX_01;
  }
  iVar2 = (int)psVar7;
  pEVar10 = &EStack_80;
  pEStack_90 = (Extension *)GetRepeatedEnum;
  SetEnum();
  uStack_98 = (ulong)in_ECX;
  pEStack_90 = pEVar5;
  pEVar5 = FindOrNull(pEVar10,iVar2);
  if (pEVar5 == (Extension *)0x0) {
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (aLStack_a8,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/extension_set.cc"
               ,0x1f8,0x14,"extension != nullptr");
    absl::lts_20240722::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20240722::log_internal::LogMessage::StringType)0>
              (aLStack_a8,0x25,"Index out-of-bounds (field is empty).");
    goto LAB_0025bee4;
  }
  if (pEVar5->is_repeated == false) {
    psVar7 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                       (1,0,
                        "(*extension).is_repeated ? REPEATED_FIELD : OPTIONAL_FIELD == REPEATED_FIELD"
                       );
  }
  else {
    psVar7 = (string *)0x0;
  }
  if (psVar7 == (string *)0x0) {
    if ((byte)(pEVar5->type - 0x13) < 0xee) {
      pLVar11 = aLStack_a8;
      GetRepeatedEnum();
LAB_0025beb4:
      psVar7 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                         ((long)pLVar11,8,
                          "cpp_type((*extension).type) == WireFormatLite::CPPTYPE_ENUM");
    }
    else {
      pLVar11 = (LogMessageFatal *)
                (ulong)*(uint *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)pEVar5->type * 4);
      if (pLVar11 != (LogMessageFatal *)0x8) goto LAB_0025beb4;
      psVar7 = (string *)0x0;
    }
    if (psVar7 == (string *)0x0) {
      piVar6 = RepeatedField<int>::Get((RepeatedField<int> *)pEVar5->field_0,index);
      return *piVar6;
    }
  }
  else {
    GetRepeatedEnum();
  }
  GetRepeatedEnum();
LAB_0025bee4:
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(aLStack_a8);
}

Assistant:

int ExtensionSet::GetEnum(int number, int default_value) const {
  const Extension* extension = FindOrNull(number);
  if (extension == nullptr || extension->is_cleared) {
    // Not present.  Return the default value.
    return default_value;
  } else {
    ABSL_DCHECK_TYPE(*extension, OPTIONAL_FIELD, ENUM);
    return extension->enum_value;
  }
}